

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void geopolyDebugFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *context_local;
  
  return;
}

Assistant:

static void geopolyDebugFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  (void)context;
  (void)argc;
#ifdef GEOPOLY_ENABLE_DEBUG
  geo_debug = sqlite3_value_int(argv[0]);
#else
  (void)argv;
#endif
}